

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1e8ba::CpuTest_asl_acc_set_c_and_z_flags_clears_n_Test::
~CpuTest_asl_acc_set_c_and_z_flags_clears_n_Test
          (CpuTest_asl_acc_set_c_and_z_flags_clears_n_Test *this)

{
  CpuTest_asl_acc_set_c_and_z_flags_clears_n_Test *this_local;
  
  ~CpuTest_asl_acc_set_c_and_z_flags_clears_n_Test(this);
  operator_delete(this,0x118);
  return;
}

Assistant:

TEST_F(CpuTest, asl_acc_set_c_and_z_flags_clears_n) {
    stage_instruction(ASL_ACC);
    registers.a = 0b10000000;
    registers.p = N_FLAG;
    expected.a = 0b00000000;
    expected.p = C_FLAG | Z_FLAG;

    step_execution(2);
    EXPECT_EQ(expected, registers);
}